

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

bool __thiscall jbcoin::STObject::clearFlag(STObject *this,uint32_t f)

{
  value_type_conflict3 vVar1;
  STBase *pSVar2;
  STInteger<unsigned_int> *local_38;
  STUInt32 *t;
  uint32_t f_local;
  STObject *this_local;
  
  pSVar2 = getPField(this,(SField *)sfFlags,false);
  if (pSVar2 == (STBase *)0x0) {
    local_38 = (STInteger<unsigned_int> *)0x0;
  }
  else {
    local_38 = (STInteger<unsigned_int> *)
               __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
  }
  if (local_38 != (STInteger<unsigned_int> *)0x0) {
    vVar1 = STInteger<unsigned_int>::value(local_38);
    STInteger<unsigned_int>::setValue(local_38,vVar1 & (f ^ 0xffffffff));
  }
  return local_38 != (STInteger<unsigned_int> *)0x0;
}

Assistant:

bool STObject::clearFlag (std::uint32_t f)
{
    STUInt32* t = dynamic_cast<STUInt32*> (getPField (sfFlags));

    if (!t)
        return false;

    t->setValue (t->value () & ~f);
    return true;
}